

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

void __thiscall cmCTestRunTest::ComputeArguments(cmCTestRunTest *this)

{
  bool bVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  cmCTestRunTest *pcVar4;
  void *this_00;
  ostream *poVar5;
  cmCTestTestProperties *pcVar6;
  string *arg;
  pointer pbVar7;
  string *env;
  char *pcVar8;
  string *exe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string testCommand;
  ostringstream cmCTestLog_msg;
  long *local_1f8;
  long local_1e8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  string local_1d0;
  cmCTestRunTest *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1d8 = &this->Arguments;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_1d8,
                    (this->Arguments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pbVar7 = (this->TestProperties->Args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  exe = pbVar7 + 1;
  if (this->TestHandler->MemCheck == true) {
    std::__cxx11::string::_M_assign((string *)&this->ActualCommand);
    cmCTestTestHandler::FindTheExecutable
              (local_1a8,this->TestHandler,
               (this->TestProperties->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=
              ((string *)
               ((this->TestProperties->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1),(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cmCTestTestHandler::FindTheExecutable(local_1a8,this->TestHandler,exe);
    std::__cxx11::string::operator=((string *)&this->ActualCommand,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    exe = pbVar7 + 2;
  }
  cmSystemTools::ConvertToOutputPath(&local_1d0,&this->ActualCommand);
  (*(this->TestHandler->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[8])
            (this->TestHandler,local_1d8,(ulong)(uint)this->Index);
  pbVar7 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1b0 = this;
  if (pbVar7 != pbVar2) {
    do {
      std::__cxx11::string::append((char *)&local_1d0);
      std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)(pbVar7->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_1d0);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  pcVar4 = local_1b0;
  if (exe != (local_1b0->TestProperties->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::append((char *)&local_1d0);
      std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)(exe->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1d8,exe);
      exe = exe + 1;
    } while (exe != (pcVar4->TestProperties->Args).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::_M_assign((string *)&(pcVar4->TestResult).FullCommandLine);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18));
  std::ostream::put((char)local_1a8);
  this_00 = (void *)std::ostream::flush();
  poVar5 = (ostream *)std::ostream::operator<<(this_00,pcVar4->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
  bVar1 = pcVar4->TestHandler->MemCheck;
  pcVar8 = "Test";
  if (bVar1 != false) {
    pcVar8 = "MemCheck";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,(ulong)bVar1 * 4 + 4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," command: ",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pcVar3 = pcVar4->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2b3,(char *)local_1f8,false);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pcVar6 = pcVar4->TestProperties;
  if ((pcVar6->Directory)._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar5 = (ostream *)std::ostream::operator<<(local_1a8,pcVar4->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Working Directory: ",0x13);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pcVar4->TestProperties->Directory)._M_dataplus._M_p,
                        (pcVar4->TestProperties->Directory)._M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar3 = pcVar4->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2ba,(char *)local_1f8,false);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pcVar6 = pcVar4->TestProperties;
  }
  if ((pcVar6->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pcVar6->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar5 = (ostream *)std::ostream::operator<<(local_1a8,pcVar4->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Environment variables: ",0x17);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar3 = pcVar4->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2c1,(char *)local_1f8,false);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pcVar6 = pcVar4->TestProperties;
    pbVar7 = (pcVar6->Environment).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pcVar6->Environment).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar7 != pbVar2) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar5 = (ostream *)std::ostream::operator<<(local_1a8,pcVar4->Index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":  ",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar3 = pcVar4->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x2c5,(char *)local_1f8,false);
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar2);
      pcVar6 = pcVar4->TestProperties;
    }
  }
  if ((pcVar6->EnvironmentModification).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pcVar6->EnvironmentModification).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar5 = (ostream *)std::ostream::operator<<(local_1a8,pcVar4->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Environment variable modifications: ",0x24);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar3 = pcVar4->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2cb,(char *)local_1f8,false);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    pbVar7 = (pcVar4->TestProperties->EnvironmentModification).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pcVar4->TestProperties->EnvironmentModification).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar7 != pbVar2) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar5 = (ostream *)std::ostream::operator<<(local_1a8,pcVar4->Index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":  ",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar3 = pcVar4->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x2d0,(char *)local_1f8,false);
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar2);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestRunTest::ComputeArguments()
{
  this->Arguments.clear(); // reset because this might be a rerun
  auto j = this->TestProperties->Args.begin();
  ++j; // skip test name
  // find the test executable
  if (this->TestHandler->MemCheck) {
    cmCTestMemCheckHandler* handler =
      static_cast<cmCTestMemCheckHandler*>(this->TestHandler);
    this->ActualCommand = handler->MemoryTester;
    this->TestProperties->Args[1] =
      this->TestHandler->FindTheExecutable(this->TestProperties->Args[1]);
  } else {
    this->ActualCommand =
      this->TestHandler->FindTheExecutable(this->TestProperties->Args[1]);
    ++j; // skip the executable (it will be actualCommand)
  }
  std::string testCommand =
    cmSystemTools::ConvertToOutputPath(this->ActualCommand);

  // Prepends memcheck args to our command string
  this->TestHandler->GenerateTestCommand(this->Arguments, this->Index);
  for (std::string const& arg : this->Arguments) {
    testCommand += " \"";
    testCommand += arg;
    testCommand += "\"";
  }

  for (; j != this->TestProperties->Args.end(); ++j) {
    testCommand += " \"";
    testCommand += *j;
    testCommand += "\"";
    this->Arguments.push_back(*j);
  }
  this->TestResult.FullCommandLine = testCommand;

  // Print the test command in verbose mode
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             std::endl
               << this->Index << ": "
               << (this->TestHandler->MemCheck ? "MemCheck" : "Test")
               << " command: " << testCommand << std::endl);

  // Print any test-specific env vars in verbose mode
  if (!this->TestProperties->Directory.empty()) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ": "
                           << "Working Directory: "
                           << this->TestProperties->Directory << std::endl);
  }

  // Print any test-specific env vars in verbose mode
  if (!this->TestProperties->Environment.empty()) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ": "
                           << "Environment variables: " << std::endl);
  }
  for (std::string const& env : this->TestProperties->Environment) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ":  " << env << std::endl);
  }
  if (!this->TestProperties->EnvironmentModification.empty()) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ": "
                           << "Environment variable modifications: "
                           << std::endl);
  }
  for (std::string const& envmod :
       this->TestProperties->EnvironmentModification) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               this->Index << ":  " << envmod << std::endl);
  }
}